

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.hpp
# Opt level: O2

Option<Kernel::TermList> __thiscall
Kernel::LAKBO::skeleton(LAKBO *this,Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison> *t)

{
  long in_RDX;
  MaybeUninit<Kernel::TermList> extraout_RDX;
  Option<Kernel::TermList> OVar1;
  OptionBase<Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
  local_30;
  
  trySkeleton<Lib::IterTraits<Lib::Stack<Kernel::PolyNf>::BottomFirstIterator>>
            ((Option<Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
              *)&local_30,(LAKBO *)t,
             (IterTraits<Lib::Stack<Kernel::PolyNf>::BottomFirstIterator>)
             *(BottomFirstIterator *)(*(long *)(in_RDX + 8) + 0x18));
  Lib::
  Option<Lib::Recycled<Lib::Stack<Kernel::TermList>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>::
  map<Kernel::LAKBO::skeleton(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>const&)const::_lambda(auto:1)_1_>
            ((Option<Lib::Recycled<Lib::Stack<Kernel::TermList>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>
              *)this,(Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison> *)&local_30);
  Lib::
  OptionBase<Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
  ::~OptionBase(&local_30);
  OVar1.super_OptionBase<Kernel::TermList>._elem._elem = extraout_RDX._elem;
  OVar1.super_OptionBase<Kernel::TermList>._0_8_ = this;
  return (Option<Kernel::TermList>)OVar1.super_OptionBase<Kernel::TermList>;
}

Assistant:

Option<TermList> skeleton(Perfect<FuncTerm> const& t) const {
    return trySkeleton(t->iterArgs())
      .map([&](auto args) {
          if (t->function().isFloor()) {
            return args[0];
          } else {
            return TermList(Term::createFromIter(
                  t->function().id(),
                  concatIters(
                    t->function().iterTypeArgs(),
                    arrayIter(*args)
                    )));
          }
      });
  }